

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

void Gia_PolynBuildOne(Pln_Man_t *p,int iMono)

{
  int iVar1;
  int iVar2;
  int Entry;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pObj_00;
  int iDriver;
  int iConst;
  int k;
  int iFan1;
  int iFan0;
  Vec_Int_t *vConst;
  Vec_Int_t *vArray;
  Gia_Obj_t *pObj;
  int iMono_local;
  Pln_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vCoefs);
  iVar2 = Hsh_VecSize(p->pHashM);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x109,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  pVVar3 = Hsh_VecReadEntry(p->pHashM,iMono);
  iVar1 = Vec_IntEntryLast(pVVar3);
  pObj_00 = Gia_ManObj(p->pGia,iVar1);
  iVar1 = Gia_ObjIsAnd(pObj_00);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjIsMux(p->pGia,pObj_00);
    if (iVar1 != 0) {
      __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                    ,0x10f,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
    }
    iVar1 = Vec_IntEntry(p->vCoefs,iMono);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p->vCoefs,iMono,0);
      p->nUsed = p->nUsed + -1;
      iVar2 = Gia_ObjFaninId0p(p->pGia,pObj_00);
      Entry = Gia_ObjFaninId1p(p->pGia,pObj_00);
      for (iDriver = 0; iDriver < 4; iDriver = iDriver + 1) {
        Vec_IntClear(p->vTempM[iDriver]);
        Vec_IntAppend(p->vTempM[iDriver],pVVar3);
        Vec_IntPop(p->vTempM[iDriver]);
        if ((iDriver == 1) || (iDriver == 3)) {
          Vec_IntPushUniqueOrderCost(p->vTempM[iDriver],iVar2,p->vOrder);
        }
        if ((iDriver == 2) || (iDriver == 3)) {
          Vec_IntPushUniqueOrderCost(p->vTempM[iDriver],Entry,p->vOrder);
        }
      }
      pVVar3 = Hsh_VecReadEntry(p->pHashC,iVar1);
      iVar2 = Gia_ObjIsXor(pObj_00);
      if (iVar2 == 0) {
        for (iDriver = 0; iDriver < 2; iDriver = iDriver + 1) {
          Vec_IntAppendMinus(p->vTempC[iDriver],pVVar3,iDriver);
        }
      }
      iVar2 = Gia_ObjIsXor(pObj_00);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninC0(pObj_00);
        if ((iVar2 == 0) || (iVar2 = Gia_ObjFaninC1(pObj_00), iVar2 == 0)) {
          iVar1 = Gia_ObjFaninC0(pObj_00);
          if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 != 0)) {
            iVar1 = Gia_ObjFaninC0(pObj_00);
            if ((iVar1 == 0) && (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 != 0)) {
              Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[1]);
              Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[3]);
            }
            else {
              Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[3]);
            }
          }
          else {
            Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[2]);
            Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[3]);
          }
        }
        else {
          Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[0]);
          Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[1]);
          pVVar3 = Hsh_VecReadEntry(p->pHashC,iVar1);
          for (iDriver = 0; iDriver < 2; iDriver = iDriver + 1) {
            Vec_IntAppendMinus(p->vTempC[iDriver],pVVar3,iDriver);
          }
          Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[2]);
          Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[3]);
        }
      }
      else {
        pVVar3 = Hsh_VecReadEntry(p->pHashC,iVar1);
        Vec_IntAppendMinus(p->vTempC[0],pVVar3,0);
        Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[1]);
        pVVar3 = Hsh_VecReadEntry(p->pHashC,iVar1);
        Vec_IntAppendMinus(p->vTempC[0],pVVar3,0);
        Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[2]);
        pVVar3 = Hsh_VecReadEntry(p->pHashC,iVar1);
        Vec_IntAppendMinus2x(p->vTempC[0],pVVar3);
        Gia_PolynBuildAdd(p,p->vTempC[0],p->vTempM[3]);
      }
    }
  }
  return;
}

Assistant:

void Gia_PolynBuildOne( Pln_Man_t * p, int iMono )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vArray, * vConst;
    int iFan0, iFan1;
    int k, iConst, iDriver;

    assert( Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM) );
    vArray  = Hsh_VecReadEntry( p->pHashM, iMono );
    iDriver = Vec_IntEntryLast( vArray );
    pObj    = Gia_ManObj( p->pGia, iDriver );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    assert( !Gia_ObjIsMux(p->pGia, pObj) );

    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst == 0 )
        return;
    Vec_IntWriteEntry( p->vCoefs, iMono, 0 );
    p->nUsed--;

    iFan0 = Gia_ObjFaninId0p(p->pGia, pObj);
    iFan1 = Gia_ObjFaninId1p(p->pGia, pObj);
    for ( k = 0; k < 4; k++ )
    {
        Vec_IntClear( p->vTempM[k] );
        Vec_IntAppend( p->vTempM[k], vArray );
        Vec_IntPop( p->vTempM[k] );
        if ( k == 1 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan0, p->vOrder );    // x
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan0 );    // x
        if ( k == 2 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan1, p->vOrder );    // y
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan1 );    // y
    }

    vConst = Hsh_VecReadEntry( p->pHashC, iConst );

    if ( !Gia_ObjIsXor(pObj) )
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );

    if ( Gia_ObjIsXor(pObj) )
    {
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 

        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 

        //if ( !p->pGia->vXors || Vec_IntFind(p->pGia->vXors, iDriver) == -1 || Vec_IntFind(p->pGia->vXors, iDriver) == 5 )
        { 
            vConst = Hsh_VecReadEntry( p->pHashC, iConst );
            Vec_IntAppendMinus2x( p->vTempC[0], vConst );
            Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   // -C * x * y 
        }
    }
    else if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )  //  C * (1 - x) * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[0] );   //  C * 1
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[1] );   // -C * x
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[2] );   // -C * y 
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
    }
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) ) //  C * (1 - x) * y
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) ) //  C * x * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else   
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
}